

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cxx
# Opt level: O0

void __thiscall
kwssys::Glob::ProcessDirectory(Glob *this,size_type start,string *dir,GlobMessages *messages)

{
  ulong uVar1;
  bool bVar2;
  undefined1 uVar3;
  size_type sVar4;
  Glob *pGVar5;
  unsigned_long uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 in_RCX;
  undefined8 in_RDX;
  Glob *in_RSI;
  string *in_RDI;
  byte bVar7;
  string fname;
  string realname;
  unsigned_long cc;
  Directory d;
  bool last;
  GlobMessages *in_stack_000002c0;
  string *in_stack_000002c8;
  size_type in_stack_000002d0;
  Glob *in_stack_000002d8;
  string *in_stack_00000f98;
  string *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec4;
  undefined1 in_stack_fffffffffffffec5;
  undefined1 in_stack_fffffffffffffec6;
  undefined1 in_stack_fffffffffffffec7;
  undefined7 in_stack_fffffffffffffee0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs_00;
  Glob *in_stack_ffffffffffffff10;
  string local_d0 [24];
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  Directory *in_stack_ffffffffffffff58;
  string local_90 [32];
  string local_70 [32];
  ulong local_50;
  undefined4 local_48;
  Status local_38;
  undefined7 in_stack_ffffffffffffffd8;
  Glob *pGVar8;
  Glob *this_00;
  
  pGVar8 = in_RSI;
  sVar4 = std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::size
                    ((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                      *)(*(long *)in_RDI + 0x18));
  bVar7 = in_RSI == (Glob *)(sVar4 - 1);
  if (((bool)bVar7) && ((in_RDI->_M_string_length & 1) != 0)) {
    bVar2 = SystemTools::FileIsDirectory(in_stack_00000f98);
    if (bVar2) {
      RecurseDirectory(in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,in_stack_000002c0);
    }
  }
  else {
    this_00 = pGVar8;
    pGVar5 = (Glob *)std::
                     vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::
                     size((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                           *)(*(long *)in_RDI + 0x18));
    if (pGVar8 < pGVar5) {
      __lhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffd0;
      Directory::Directory
                ((Directory *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,
                                   CONCAT15(in_stack_fffffffffffffec5,
                                            CONCAT14(in_stack_fffffffffffffec4,
                                                     in_stack_fffffffffffffec0)))));
      local_38 = Directory::Load(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                                 in_stack_ffffffffffffff48);
      uVar3 = Status::operator_cast_to_bool((Status *)0x1c2fb0);
      if (((uVar3 ^ 0xff) & 1) == 0) {
        std::__cxx11::string::string(local_70);
        std::__cxx11::string::string(local_90);
        for (local_50 = 0; uVar1 = local_50,
            uVar6 = Directory::GetNumberOfFiles((Directory *)0x1c302b), uVar1 < uVar6;
            local_50 = local_50 + 1) {
          __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  Directory::GetFile((Directory *)
                                     CONCAT17(in_stack_fffffffffffffec7,
                                              CONCAT16(in_stack_fffffffffffffec6,
                                                       CONCAT15(in_stack_fffffffffffffec5,
                                                                CONCAT14(in_stack_fffffffffffffec4,
                                                                         in_stack_fffffffffffffec0))
                                                      )),(unsigned_long)in_stack_fffffffffffffeb8);
          std::__cxx11::string::operator=(local_90,(char *)__lhs);
          in_stack_fffffffffffffec7 =
               std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(in_stack_fffffffffffffec7,
                                        CONCAT16(in_stack_fffffffffffffec6,
                                                 CONCAT15(in_stack_fffffffffffffec5,
                                                          CONCAT14(in_stack_fffffffffffffec4,
                                                                   in_stack_fffffffffffffec0)))),
                               (char *)in_stack_fffffffffffffeb8);
          if ((!(bool)in_stack_fffffffffffffec7) &&
             (in_stack_fffffffffffffec6 =
                   std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffec7,
                                               CONCAT16(in_stack_fffffffffffffec6,
                                                        CONCAT15(in_stack_fffffffffffffec5,
                                                                 CONCAT14(in_stack_fffffffffffffec4,
                                                                          in_stack_fffffffffffffec0)
                                                                ))),
                                   (char *)in_stack_fffffffffffffeb8),
             !(bool)in_stack_fffffffffffffec6)) {
            if (this_00 == (Glob *)0x0) {
              std::operator+(__lhs_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
              std::__cxx11::string::operator=(local_70,(string *)&stack0xffffffffffffff50);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
            }
            else {
              std::operator+(__lhs_00,(char *)CONCAT17(uVar3,in_stack_fffffffffffffee0));
              std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffec7,
                                               CONCAT16(in_stack_fffffffffffffec6,
                                                        CONCAT15(in_stack_fffffffffffffec5,
                                                                 CONCAT14(in_stack_fffffffffffffec4,
                                                                          in_stack_fffffffffffffec0)
                                                                ))));
              std::__cxx11::string::operator=(local_70,local_d0);
              std::__cxx11::string::~string(local_d0);
              std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
            }
            if ((((bVar7 & 1) != 0) ||
                (in_stack_fffffffffffffec5 = SystemTools::FileIsDirectory(in_stack_00000f98),
                (bool)in_stack_fffffffffffffec5)) &&
               (((in_RDI[2].field_2._M_local_buf[0] & 1U) != 0 ||
                (((bVar7 & 1) == 0 ||
                 (in_stack_fffffffffffffec4 = SystemTools::FileIsDirectory(in_stack_00000f98),
                 !(bool)in_stack_fffffffffffffec4)))))) {
              std::vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>::
              operator[]((vector<kwssys::RegularExpression,_std::allocator<kwssys::RegularExpression>_>
                          *)(*(long *)in_RDI + 0x18),(size_type)this_00);
              bVar2 = RegularExpression::find
                                ((RegularExpression *)
                                 CONCAT17(in_stack_fffffffffffffec7,
                                          CONCAT16(in_stack_fffffffffffffec6,
                                                   CONCAT15(in_stack_fffffffffffffec5,
                                                            CONCAT14(in_stack_fffffffffffffec4,
                                                                     in_stack_fffffffffffffec0)))),
                                 in_stack_fffffffffffffeb8);
              in_stack_fffffffffffffec0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffec0);
              if (bVar2) {
                if ((bVar7 & 1) == 0) {
                  ProcessDirectory(this_00,in_RDX,(string *)in_RCX,
                                   (GlobMessages *)CONCAT17(bVar7,in_stack_ffffffffffffffd8));
                }
                else {
                  AddFile(in_stack_ffffffffffffff10,
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_RSI,in_RDI);
                }
              }
            }
          }
        }
        std::__cxx11::string::~string(local_90);
        std::__cxx11::string::~string(local_70);
        local_48 = 0;
      }
      else {
        local_48 = 1;
      }
      Directory::~Directory
                ((Directory *)
                 CONCAT17(in_stack_fffffffffffffec7,
                          CONCAT16(in_stack_fffffffffffffec6,
                                   CONCAT15(in_stack_fffffffffffffec5,
                                            CONCAT14(in_stack_fffffffffffffec4,
                                                     in_stack_fffffffffffffec0)))));
    }
  }
  return;
}

Assistant:

void Glob::ProcessDirectory(std::string::size_type start,
                            const std::string& dir, GlobMessages* messages)
{
  // std::cout << "ProcessDirectory: " << dir << std::endl;
  bool last = (start == this->Internals->Expressions.size() - 1);
  if (last && this->Recurse) {
    if (kwsys::SystemTools::FileIsDirectory(dir)) {
      this->RecurseDirectory(start, dir, messages);
    }
    return;
  }

  if (start >= this->Internals->Expressions.size()) {
    return;
  }

  kwsys::Directory d;
  if (!d.Load(dir)) {
    return;
  }
  unsigned long cc;
  std::string realname;
  std::string fname;
  for (cc = 0; cc < d.GetNumberOfFiles(); cc++) {
    fname = d.GetFile(cc);
    if (fname == "." || fname == "..") {
      continue;
    }

    if (start == 0) {
      realname = dir + fname;
    } else {
      realname = dir + "/" + fname;
    }

#if defined(KWSYS_GLOB_CASE_INDEPENDENT)
    // On case-insensitive file systems convert to lower case for matching.
    fname = kwsys::SystemTools::LowerCase(fname);
#endif

    // std::cout << "Look at file: " << fname << std::endl;
    // std::cout << "Match: "
    // << this->Internals->TextExpressions[start].c_str() << std::endl;
    // std::cout << "Real name: " << realname << std::endl;

    if ((!last && !kwsys::SystemTools::FileIsDirectory(realname)) ||
        (!this->ListDirs && last &&
         kwsys::SystemTools::FileIsDirectory(realname))) {
      continue;
    }

    if (this->Internals->Expressions[start].find(fname)) {
      if (last) {
        this->AddFile(this->Internals->Files, realname);
      } else {
        this->ProcessDirectory(start + 1, realname, messages);
      }
    }
  }
}